

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef __thiscall llvm::sys::path::filename(path *this,StringRef path,Style style)

{
  StringRef SVar1;
  undefined1 local_40 [8];
  reverse_iterator I;
  
  I.Path.Data = path.Data;
  I.Path.Length = 0;
  I.Component.Data = (char *)0x0;
  I.Position._0_4_ = (undefined4)path.Length;
  local_40 = (undefined1  [8])this;
  I.Component.Length = (size_t)I.Path.Data;
  reverse_iterator::operator++((reverse_iterator *)local_40);
  SVar1.Length = (size_t)I.Component.Data;
  SVar1.Data = (char *)I.Path.Length;
  return SVar1;
}

Assistant:

StringRef filename(StringRef path, Style style) { return *rbegin(path, style); }